

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.h
# Opt level: O1

Mat * __thiscall
ncnn::Mat::reshape(Mat *__return_storage_ptr__,Mat *this,int _w,Allocator *allocator)

{
  int *piVar1;
  size_t sVar2;
  int iVar3;
  long lVar4;
  
  if (this->h * this->w * this->c == _w) {
    iVar3 = this->dims;
    if ((iVar3 == 3) && (this->cstep != (long)this->h * (long)this->w)) {
      __return_storage_ptr__->dims = 0;
      __return_storage_ptr__->w = 0;
      __return_storage_ptr__->h = 0;
      __return_storage_ptr__->c = 0;
      __return_storage_ptr__->elemsize = 0;
      __return_storage_ptr__->allocator = (Allocator *)0x0;
      __return_storage_ptr__->data = (void *)0x0;
      __return_storage_ptr__->refcount = (int *)0x0;
      __return_storage_ptr__->cstep = 0;
      create(__return_storage_ptr__,_w,this->elemsize,allocator);
      if (0 < this->c) {
        lVar4 = 0;
        do {
          sVar2 = this->elemsize;
          iVar3 = this->h * this->w;
          memcpy((void *)((long)((int)lVar4 * iVar3) * sVar2 + (long)__return_storage_ptr__->data),
                 (void *)(this->cstep * lVar4 * sVar2 + (long)this->data),(long)iVar3 * sVar2);
          lVar4 = lVar4 + 1;
        } while (lVar4 < this->c);
      }
    }
    else {
      __return_storage_ptr__->data = this->data;
      piVar1 = this->refcount;
      __return_storage_ptr__->refcount = piVar1;
      __return_storage_ptr__->elemsize = this->elemsize;
      __return_storage_ptr__->allocator = this->allocator;
      __return_storage_ptr__->dims = iVar3;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      iVar3 = this->h;
      __return_storage_ptr__->w = this->w;
      __return_storage_ptr__->h = iVar3;
      __return_storage_ptr__->dims = 1;
      __return_storage_ptr__->w = _w;
      __return_storage_ptr__->h = 1;
      __return_storage_ptr__->c = 1;
      __return_storage_ptr__->cstep = (long)_w;
    }
  }
  else {
    __return_storage_ptr__->dims = 0;
    __return_storage_ptr__->w = 0;
    __return_storage_ptr__->h = 0;
    __return_storage_ptr__->c = 0;
    __return_storage_ptr__->elemsize = 0;
    __return_storage_ptr__->allocator = (Allocator *)0x0;
    __return_storage_ptr__->data = (void *)0x0;
    __return_storage_ptr__->refcount = (int *)0x0;
    __return_storage_ptr__->cstep = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

inline Mat Mat::reshape(int _w, Allocator* allocator) const
{
    if (w * h * c != _w)
        return Mat();

    if (dims == 3 && cstep != (size_t)w * h)
    {
        Mat m;
        m.create(_w, elemsize, allocator);

        // flatten
        for (int i=0; i<c; i++)
        {
            const void* ptr = (unsigned char*)data + i * cstep * elemsize;
            void* mptr = (unsigned char*)m.data + i * w * h * elemsize;
            memcpy(mptr, ptr, w * h * elemsize);
        }

        return m;
    }

    Mat m = *this;

    m.dims = 1;
    m.w = _w;
    m.h = 1;
    m.c = 1;

    m.cstep = _w;

    return m;
}